

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_build_8bit_table(png_structrp png_ptr,png_bytepp ptable,png_fixed_point gamma_val)

{
  png_byte pVar1;
  int iVar2;
  png_byte *ppVar3;
  png_bytep table;
  uint i;
  png_fixed_point gamma_val_local;
  png_bytepp ptable_local;
  png_structrp png_ptr_local;
  
  ppVar3 = (png_byte *)png_malloc(png_ptr,0x100);
  *ptable = ppVar3;
  iVar2 = png_gamma_significant(gamma_val);
  if (iVar2 == 0) {
    for (table._0_4_ = 0; (uint)table < 0x100; table._0_4_ = (uint)table + 1) {
      ppVar3[(uint)table] = (png_byte)(uint)table;
    }
  }
  else {
    for (table._0_4_ = 0; (uint)table < 0x100; table._0_4_ = (uint)table + 1) {
      pVar1 = png_gamma_8bit_correct((uint)table,gamma_val);
      ppVar3[(uint)table] = pVar1;
    }
  }
  return;
}

Assistant:

static void
png_build_8bit_table(png_structrp png_ptr, png_bytepp ptable,
    png_fixed_point gamma_val)
{
   unsigned int i;
   png_bytep table = *ptable = (png_bytep)png_malloc(png_ptr, 256);

   if (png_gamma_significant(gamma_val) != 0)
      for (i=0; i<256; i++)
         table[i] = png_gamma_8bit_correct(i, gamma_val);

   else
      for (i=0; i<256; ++i)
         table[i] = (png_byte)(i & 0xff);
}